

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O1

void keep_one_mv_stat(MV_STATS *mv_stats,MV *ref_mv,MV *cur_mv,AV1_COMP *cpi)

{
  nmv_component *pnVar1;
  _Bool _Var2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  FRAME_CONTEXT *pFVar8;
  short sVar9;
  byte bVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  ushort uVar27;
  int iVar28;
  aom_cdf_prob *paVar29;
  ushort uVar30;
  uint uVar31;
  int iVar32;
  aom_cdf_prob (*paaVar33) [5];
  ushort uVar34;
  int i;
  ulong uVar35;
  aom_cdf_prob *paVar36;
  long lVar37;
  uint uVar38;
  aom_cdf_prob *paVar39;
  nmv_component *pnVar40;
  uint uVar41;
  bool bVar42;
  
  pFVar8 = (cpi->td).mb.e_mbd.tile_ctx;
  _Var2 = (cpi->common).features.allow_high_precision_mv;
  uVar26 = cur_mv->row - ref_mv->row;
  uVar30 = cur_mv->col - ref_mv->col;
  bVar10 = (uVar26 != 0) * '\x02' | uVar30 != 0;
  uVar34 = uVar30;
  uVar27 = uVar26;
  if (_Var2 == true) {
    uVar34 = uVar30 - ((short)uVar30 >> 0xf) & 0xfffe;
    uVar27 = uVar26 - ((short)uVar26 >> 0xf) & 0xfffe;
  }
  uVar31 = (uint)(uVar30 != 0) + (uint)(uVar26 != 0) * 2;
  uVar24 = (ulong)bVar10;
  uVar41 = 0;
  if (bVar10 != 0) {
    uVar41 = (uint)(ushort)(0x8000 - (pFVar8->nmvc).joints_cdf[uVar24 - 1]);
  }
  uVar41 = (-(uint)(pFVar8->nmvc).joints_cdf[uVar24] - 0x8000 & 0xffff) - uVar41;
  if ((int)uVar41 < 5) {
    uVar41 = 4;
  }
  uVar41 = uVar41 & 0xffff;
  if (0x7ffe < uVar41) {
    uVar41 = 0x7fff;
  }
  if (uVar41 < 2) {
    uVar41 = 1;
  }
  uVar38 = 0x1f;
  if (uVar41 != 0) {
    for (; uVar41 >> uVar38 == 0; uVar38 = uVar38 - 1) {
    }
  }
  uVar41 = uVar41 << ((byte)(~uVar38 + 0xf) & 0x1f);
  uVar21 = (uint)(uVar34 != 0) + (uint)(uVar27 != 0) * 2;
  uVar12 = (uint)((ulong)uVar41 * 0x100 + 0x4000 >> 0xf);
  uVar16 = 0;
  if (uVar31 != 0) {
    uVar16 = (uint)(ushort)(0x8000 - (pFVar8->nmvc).joints_cdf[(ulong)uVar31 - 1]);
  }
  uVar16 = (-(uint)(pFVar8->nmvc).joints_cdf[uVar31] - 0x8000 & 0xffff) - uVar16;
  uVar31 = 4;
  if (4 < (int)uVar16) {
    uVar31 = uVar16;
  }
  uVar31 = uVar31 & 0xffff;
  if (0x7ffe < uVar31) {
    uVar31 = 0x7fff;
  }
  uVar16 = 1;
  if (1 < uVar31) {
    uVar16 = uVar31;
  }
  uVar31 = 0x1f;
  if (uVar16 != 0) {
    for (; uVar16 >> uVar31 == 0; uVar31 = uVar31 - 1) {
    }
  }
  uVar16 = uVar16 << ((byte)(~uVar31 + 0xf) & 0x1f);
  uVar3 = *(ushort *)
           (block_size_high +
           (ulong)((uVar41 < 0x40 | uVar12 | 0xff - uVar12 >> 0x17) & 0xff) * 2 + 0x10);
  uVar41 = (uint)((ulong)uVar16 * 0x100 + 0x4000 >> 0xf);
  uVar11 = *(ushort *)
            (block_size_high +
            (ulong)((uVar16 < 0x40 | uVar41 | 0xff - uVar41 >> 0x17) & 0xff) * 2 + 0x10);
  if (uVar21 == 0) {
    uVar41 = 0;
  }
  else {
    uVar41 = (uint)(ushort)(0x8000 - (pFVar8->nmvc).joints_cdf[(ulong)uVar21 - 1]);
  }
  uVar41 = (-(uint)(pFVar8->nmvc).joints_cdf[uVar21] - 0x8000 & 0xffff) - uVar41;
  uVar16 = 4;
  if (4 < (int)uVar41) {
    uVar16 = uVar41;
  }
  uVar16 = uVar16 & 0xffff;
  if (0x7ffe < uVar16) {
    uVar16 = 0x7fff;
  }
  uVar41 = 1;
  if (1 < uVar16) {
    uVar41 = uVar16;
  }
  uVar16 = 0x1f;
  if (uVar41 != 0) {
    for (; uVar41 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  uVar41 = uVar41 << ((byte)(~uVar16 + 0xf) & 0x1f);
  uVar21 = (uint)((ulong)uVar41 * 0x100 + 0x4000 >> 0xf);
  uVar4 = *(ushort *)
           (block_size_high +
           (ulong)((uVar41 < 0x40 | uVar21 | 0xff - uVar21 >> 0x17) & 0xff) * 2 + 0x10);
  uVar5 = (pFVar8->nmvc).joints_cdf[4];
  bVar10 = (char)(uVar5 >> 4) + 5;
  uVar35 = 0;
  do {
    uVar6 = (pFVar8->nmvc).joints_cdf[uVar35];
    if (uVar35 < uVar24) {
      sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar10 & 0x1f));
    }
    else {
      sVar9 = -(uVar6 >> (bVar10 & 0x1f));
    }
    (pFVar8->nmvc).joints_cdf[uVar35] = sVar9 + uVar6;
    uVar35 = uVar35 + 1;
  } while (uVar35 != 3);
  paVar39 = (pFVar8->nmvc).joints_cdf + 4;
  *paVar39 = *paVar39 + (ushort)(uVar5 < 0x20);
  mv_stats->total_mv_rate = mv_stats->total_mv_rate + (~uVar38 + 0xf) * 0x200 + (uint)uVar3;
  mv_stats->hp_total_mv_rate = mv_stats->hp_total_mv_rate + (~uVar31 + 0xf) * 0x200 + (uint)uVar11;
  mv_stats->lp_total_mv_rate = mv_stats->lp_total_mv_rate + (~uVar16 + 0xf) * 0x200 + (uint)uVar4;
  mv_stats->mv_joint_count[uVar24] = mv_stats->mv_joint_count[uVar24] + 1;
  iVar19 = mv_stats->total_mv_rate;
  iVar23 = mv_stats->hp_total_mv_rate;
  iVar20 = mv_stats->lp_total_mv_rate;
  pnVar1 = (pFVar8->nmvc).comps;
  paVar39 = (pFVar8->nmvc).comps[0].bits_cdf[0] + 2;
  lVar37 = 0;
  pnVar40 = pnVar1;
  do {
    uVar11 = uVar34;
    uVar3 = uVar30;
    if (lVar37 == 0) {
      uVar11 = uVar27;
      uVar3 = uVar26;
    }
    iVar13 = 0;
    iVar18 = 0;
    iVar22 = 0;
    iVar28 = 0;
    iVar32 = 0;
    iVar17 = 0;
    if (uVar3 != 0) {
      uVar31 = (uint)(short)uVar3;
      uVar41 = -uVar31;
      if (0 < (int)uVar31) {
        uVar41 = uVar31;
      }
      uVar16 = uVar41 - 1;
      uVar38 = 0x1f;
      if ((int)uVar16 >> 3 != 0) {
        for (; (uint)((int)uVar16 >> 3) >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar21 = 0;
      if (uVar41 < 9) {
        uVar38 = uVar21;
      }
      bVar10 = (byte)uVar38;
      uVar38 = -8 << (bVar10 & 0x1f);
      if (bVar10 == 0) {
        uVar38 = uVar21;
      }
      uVar41 = (uVar38 - 1) + uVar41;
      paVar29 = (pFVar8->nmvc).comps[0].hp_cdf;
      if (bVar10 == 0) {
        paVar29 = (pFVar8->nmvc).comps[0].class0_hp_cdf;
      }
      paVar29 = paVar29 + lVar37 * 0x45;
      uVar38 = (int)uVar41 >> 3;
      paaVar33 = pnVar1[lVar37].class0_fp_cdf + (int)uVar38;
      if (bVar10 != 0) {
        paaVar33 = &(pFVar8->nmvc).comps[lVar37].fp_cdf;
      }
      if ((short)uVar3 < 0) {
        uVar21 = (uint)(ushort)(0x8000 - pnVar1[lVar37].fp_cdf[(ulong)(uVar31 >> 0x1f) + 4]);
      }
      uVar21 = (-(uint)pnVar1[lVar37].sign_cdf[uVar31 >> 0x1f] - 0x8000 & 0xffff) - uVar21;
      if ((int)uVar21 < 5) {
        uVar21 = 4;
      }
      uVar21 = uVar21 & 0xffff;
      if (0x7ffe < uVar21) {
        uVar21 = 0x7fff;
      }
      if (uVar21 < 2) {
        uVar21 = 1;
      }
      uVar31 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar21 = uVar21 << ((byte)(~uVar31 + 0xf) & 0x1f);
      uVar4 = pnVar1[lVar37].sign_cdf[2];
      bVar15 = (char)(uVar4 >> 4) + 4;
      uVar5 = pnVar1[lVar37].sign_cdf[0];
      if ((short)uVar3 < 0) {
        sVar9 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar15 & 0x1f));
      }
      else {
        sVar9 = -(uVar5 >> (bVar15 & 0x1f));
      }
      uVar12 = (uint)((ulong)uVar21 * 0x100 + 0x4000 >> 0xf);
      uVar6 = *(ushort *)
               (block_size_high +
               (ulong)((uVar21 < 0x40 | uVar12 | 0xff - uVar12 >> 0x17) & 0xff) * 2 + 0x10);
      pnVar1[lVar37].sign_cdf[0] = uVar5 + sVar9;
      pnVar1[lVar37].sign_cdf[2] = uVar4 + (uVar4 < 0x20);
      uVar24 = (ulong)bVar10;
      if (bVar10 == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (uint)(ushort)(0x8000 - pnVar1[lVar37].classes_cdf[uVar24 - 1]);
      }
      uVar12 = uVar16 >> 1 & 3;
      uVar16 = uVar16 & 1;
      iVar13 = (~uVar31 + 0xf) * 0x200 + (uint)uVar6;
      uVar21 = (-(uint)pnVar1[lVar37].classes_cdf[uVar24] - 0x8000 & 0xffff) - uVar21;
      if ((int)uVar21 < 5) {
        uVar21 = 4;
      }
      uVar21 = uVar21 & 0xffff;
      if (0x7ffe < uVar21) {
        uVar21 = 0x7fff;
      }
      if (uVar21 < 2) {
        uVar21 = 1;
      }
      uVar31 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar21 = uVar21 << ((byte)(~uVar31 + 0xf) & 0x1f);
      uVar14 = (uint)((ulong)uVar21 * 0x100 + 0x4000 >> 0xf);
      uVar4 = *(ushort *)
               (block_size_high +
               (ulong)((uVar21 < 0x40 | uVar14 | 0xff - uVar14 >> 0x17) & 0xff) * 2 + 0x10);
      uVar5 = pnVar1[lVar37].classes_cdf[0xb];
      bVar15 = (char)(uVar5 >> 4) + 5;
      uVar35 = 0;
      do {
        uVar6 = pnVar40->classes_cdf[uVar35];
        if (uVar35 < uVar24) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar15 & 0x1f));
        }
        else {
          sVar9 = -(uVar6 >> (bVar15 & 0x1f));
        }
        pnVar40->classes_cdf[uVar35] = sVar9 + uVar6;
        uVar35 = uVar35 + 1;
      } while (uVar35 != 10);
      pnVar1[lVar37].classes_cdf[0xb] = pnVar1[lVar37].classes_cdf[0xb] + (ushort)(uVar5 < 0x20);
      if (bVar10 == 0) {
        uVar21 = 0;
        if (7 < uVar41) {
          uVar21 = (uint)(ushort)(0x8000 - pnVar1[lVar37].hp_cdf[(long)(int)uVar38 + 2]);
        }
        uVar21 = (-(uint)pnVar1[lVar37].class0_cdf[(int)uVar38] - 0x8000 & 0xffff) - uVar21;
        if ((int)uVar21 < 5) {
          uVar21 = 4;
        }
        uVar21 = uVar21 & 0xffff;
        if (0x7ffe < uVar21) {
          uVar21 = 0x7fff;
        }
        if (uVar21 < 2) {
          uVar21 = 1;
        }
        uVar41 = 0x1f;
        if (uVar21 != 0) {
          for (; uVar21 >> uVar41 == 0; uVar41 = uVar41 - 1) {
          }
        }
        uVar21 = uVar21 << ((byte)(~uVar41 + 0xf) & 0x1f);
        uVar5 = pnVar1[lVar37].class0_cdf[2];
        bVar10 = (char)(uVar5 >> 4) + 4;
        uVar6 = pnVar1[lVar37].class0_cdf[0];
        if ((char)uVar38 < '\x01') {
          sVar9 = -(uVar6 >> (bVar10 & 0x1f));
        }
        else {
          sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar10 & 0x1f));
        }
        uVar38 = (uint)((ulong)uVar21 * 0x100 + 0x4000 >> 0xf);
        iVar22 = (~uVar41 + 0xf) * 0x200 +
                 (uint)*(ushort *)
                        (block_size_high +
                        (ulong)((uVar21 < 0x40 | uVar38 | 0xff - uVar38 >> 0x17) & 0xff) * 2 + 0x10)
        ;
        pnVar1[lVar37].class0_cdf[0] = sVar9 + uVar6;
        pnVar1[lVar37].class0_cdf[2] = uVar5 + (uVar5 < 0x20);
      }
      else {
        uVar35 = 0;
        iVar22 = 0;
        paVar36 = paVar39;
        do {
          bVar42 = (uVar38 >> ((uint)uVar35 & 0x1f) & 1) != 0;
          uVar25 = (ulong)bVar42;
          uVar41 = 0;
          if (bVar42) {
            uVar41 = (uint)(ushort)(0x8000 - paVar36[uVar25 - 3]);
          }
          uVar41 = (-(uint)paVar36[uVar25 - 2] - 0x8000 & 0xffff) - uVar41;
          if ((int)uVar41 < 5) {
            uVar41 = 4;
          }
          uVar41 = uVar41 & 0xffff;
          if (0x7ffe < uVar41) {
            uVar41 = 0x7fff;
          }
          if (uVar41 < 2) {
            uVar41 = 1;
          }
          uVar21 = 0x1f;
          if (uVar41 != 0) {
            for (; uVar41 >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          uVar41 = uVar41 << ((byte)(~uVar21 + 0xf) & 0x1f);
          uVar5 = *paVar36;
          bVar10 = (char)(uVar5 >> 4) + 4;
          uVar6 = (*(aom_cdf_prob (*) [3])(paVar36 + -2))[0];
          if (uVar25 == 0) {
            sVar9 = -(uVar6 >> (bVar10 & 0x1f));
          }
          else {
            sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar10 & 0x1f));
          }
          uVar14 = (uint)((ulong)uVar41 * 0x100 + 0x4000 >> 0xf);
          uVar7 = *(ushort *)
                   (block_size_high +
                   (ulong)((uVar41 < 0x40 | uVar14 | 0xff - uVar14 >> 0x17) & 0xff) * 2 + 0x10);
          (*(aom_cdf_prob (*) [3])(paVar36 + -2))[0] = sVar9 + uVar6;
          iVar22 = iVar22 + (uint)uVar7 + (~uVar21 + 0xf) * 0x200;
          *paVar36 = uVar5 + (uVar5 < 0x20);
          uVar35 = uVar35 + 1;
          paVar36 = paVar36 + 3;
        } while (uVar24 != uVar35);
      }
      uVar24 = (ulong)uVar12;
      if (uVar12 == 0) {
        uVar41 = 0;
      }
      else {
        uVar41 = (uint)(ushort)(0x8000 - *(aom_cdf_prob *)((long)(paaVar33 + -1) + (uVar24 + 4) * 2)
                               );
      }
      iVar18 = (~uVar31 + 0xf) * 0x200 + (uint)uVar4;
      uVar41 = (-(uint)(*paaVar33)[uVar24] - 0x8000 & 0xffff) - uVar41;
      if ((int)uVar41 < 5) {
        uVar41 = 4;
      }
      uVar41 = uVar41 & 0xffff;
      if (0x7ffe < uVar41) {
        uVar41 = 0x7fff;
      }
      if (uVar41 < 2) {
        uVar41 = 1;
      }
      uVar31 = 0x1f;
      if (uVar41 != 0) {
        for (; uVar41 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar41 = uVar41 << ((byte)(~uVar31 + 0xf) & 0x1f);
      uVar38 = (uint)((ulong)uVar41 * 0x100 + 0x4000 >> 0xf);
      uVar4 = *(ushort *)
               (block_size_high +
               (ulong)((uVar41 < 0x40 | uVar38 | 0xff - uVar38 >> 0x17) & 0xff) * 2 + 0x10);
      uVar5 = (*paaVar33)[4];
      bVar10 = (char)(uVar5 >> 4) + 5;
      uVar35 = 0;
      do {
        uVar6 = (*paaVar33)[uVar35];
        if (uVar35 < uVar24) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar10 & 0x1f));
        }
        else {
          sVar9 = -(uVar6 >> (bVar10 & 0x1f));
        }
        (*paaVar33)[uVar35] = sVar9 + uVar6;
        uVar35 = uVar35 + 1;
      } while (uVar35 != 3);
      (*paaVar33)[4] = (*paaVar33)[4] + (ushort)(uVar5 < 0x20);
      iVar32 = 0;
      if (_Var2 != false) {
        uVar41 = 0;
        if (uVar16 != 0) {
          uVar41 = (uint)(ushort)(0x8000 - paVar29[(ulong)uVar16 - 1]);
        }
        uVar41 = (-(uint)paVar29[uVar16] - 0x8000 & 0xffff) - uVar41;
        if ((int)uVar41 < 5) {
          uVar41 = 4;
        }
        uVar41 = uVar41 & 0xffff;
        if (0x7ffe < uVar41) {
          uVar41 = 0x7fff;
        }
        if (uVar41 < 2) {
          uVar41 = 1;
        }
        uVar38 = 0x1f;
        if (uVar41 != 0) {
          for (; uVar41 >> uVar38 == 0; uVar38 = uVar38 - 1) {
          }
        }
        uVar41 = uVar41 << ((byte)(~uVar38 + 0xf) & 0x1f);
        uVar21 = (uint)((ulong)uVar41 * 0x100 + 0x4000 >> 0xf);
        iVar32 = (~uVar38 + 0xf) * 0x200 +
                 (uint)*(ushort *)
                        (block_size_high +
                        (ulong)((uVar41 < 0x40 | uVar21 | 0xff - uVar21 >> 0x17) & 0xff) * 2 + 0x10)
        ;
      }
      if (_Var2 != false) {
        uVar5 = paVar29[2];
        bVar10 = (char)(uVar5 >> 4) + 4;
        uVar6 = *paVar29;
        if (uVar16 == 0) {
          sVar9 = -(uVar6 >> (bVar10 & 0x1f));
        }
        else {
          sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar10 & 0x1f));
        }
        *paVar29 = uVar6 + sVar9;
        paVar29[2] = uVar5 + (uVar5 < 0x20);
      }
      mv_stats->last_bit_zero = mv_stats->last_bit_zero + (uVar16 ^ 1);
      iVar28 = (~uVar31 + 0xf) * 0x200 + (uint)uVar4;
      mv_stats->last_bit_nonzero = mv_stats->last_bit_nonzero + uVar16;
      iVar17 = iVar18 + iVar13 + iVar22 + iVar28 + iVar32;
    }
    iVar18 = iVar13 + iVar18 + iVar22 + iVar28;
    iVar13 = iVar32 + iVar18;
    if (uVar3 == 0) {
      iVar13 = 0;
    }
    if (uVar11 == 0) {
      iVar18 = 0;
    }
    iVar19 = iVar19 + iVar17;
    iVar23 = iVar23 + iVar13;
    iVar20 = iVar20 + iVar18;
    pnVar40 = pnVar40 + 1;
    paVar39 = paVar39 + 0x45;
    bVar42 = lVar37 == 0;
    lVar37 = lVar37 + 1;
  } while (bVar42);
  mv_stats->total_mv_rate = iVar19;
  mv_stats->hp_total_mv_rate = iVar23;
  mv_stats->lp_total_mv_rate = iVar20;
  return;
}

Assistant:

static inline void keep_one_mv_stat(MV_STATS *mv_stats, const MV *ref_mv,
                                    const MV *cur_mv, const AV1_COMP *cpi) {
  const MACROBLOCK *const x = &cpi->td.mb;
  const MACROBLOCKD *const xd = &x->e_mbd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  nmv_context *nmvc = &ec_ctx->nmvc;
  aom_cdf_prob *joint_cdf = nmvc->joints_cdf;
  const int use_hp = cpi->common.features.allow_high_precision_mv;

  const MV diff = { cur_mv->row - ref_mv->row, cur_mv->col - ref_mv->col };
  const int mv_joint = av1_get_mv_joint(&diff);
  // TODO(chiyotsai@google.com): Estimate hp_diff when we are using lp
  const MV hp_diff = diff;
  const int hp_mv_joint = av1_get_mv_joint(&hp_diff);
  const MV truncated_diff = { (diff.row / 2) * 2, (diff.col / 2) * 2 };
  const MV lp_diff = use_hp ? truncated_diff : diff;
  const int lp_mv_joint = av1_get_mv_joint(&lp_diff);

  const int mv_joint_rate = get_symbol_cost(joint_cdf, mv_joint);
  const int hp_mv_joint_rate = get_symbol_cost(joint_cdf, hp_mv_joint);
  const int lp_mv_joint_rate = get_symbol_cost(joint_cdf, lp_mv_joint);

  update_cdf(joint_cdf, mv_joint, MV_JOINTS);

  mv_stats->total_mv_rate += mv_joint_rate;
  mv_stats->hp_total_mv_rate += hp_mv_joint_rate;
  mv_stats->lp_total_mv_rate += lp_mv_joint_rate;
  mv_stats->mv_joint_count[mv_joint]++;

  for (int comp_idx = 0; comp_idx < 2; comp_idx++) {
    const int comp_val = comp_idx ? diff.col : diff.row;
    const int hp_comp_val = comp_idx ? hp_diff.col : hp_diff.row;
    const int lp_comp_val = comp_idx ? lp_diff.col : lp_diff.row;
    int rates[5];
    av1_zero_array(rates, 5);

    const int comp_rate =
        comp_val ? keep_one_comp_stat(mv_stats, comp_val, comp_idx, cpi, rates)
                 : 0;
    // TODO(chiyotsai@google.com): Properly get hp rate when use_hp is false
    const int hp_rate =
        hp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] + rates[4] : 0;
    const int lp_rate =
        lp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] : 0;

    mv_stats->total_mv_rate += comp_rate;
    mv_stats->hp_total_mv_rate += hp_rate;
    mv_stats->lp_total_mv_rate += lp_rate;
  }
}